

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblocking_notifier.hpp
# Opt level: O1

void __thiscall tf::NonblockingNotifierV2::notify_n(NonblockingNotifierV2 *this,size_t n)

{
  if (n < (ulong)((long)(this->_waiters).
                        super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->_waiters).
                        super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 7)) {
    if (n != 0) {
      do {
        _notify<false>(this);
        n = n - 1;
      } while (n != 0);
    }
    return;
  }
  _notify<true>(this);
  return;
}

Assistant:

void notify_n(size_t n) {
    if(n >= _waiters.size()) {
      _notify<true>();
    }
    else {
      for(size_t k=0; k<n; ++k) {
        _notify<false>();
      }
    }
  }